

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

String * axl::io::getFileName(StringRef *filePath)

{
  size_t sVar1;
  StringRef *in_RDI;
  size_t i;
  StringRef *this;
  undefined7 in_stack_ffffffffffffffb8;
  C in_stack_ffffffffffffffbf;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  sVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::reverseFind
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,(size_t)in_RDI);
  if (sVar1 == 0xffffffffffffffff) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(this,in_RDI);
  }
  else {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffffc0,
             (StringRef *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16dc77);
  return (String *)this;
}

Assistant:

sl::String
getFileName(const sl::StringRef& filePath) {
#if (_AXL_OS_WIN)
	char buffer[256];
	sl::String_w filePath_w(rc::BufKind_Stack, buffer, sizeof(buffer));
	filePath_w = filePath;

	wchar_t fileName[1024] = { 0 };
	wchar_t extension[1024] = { 0 };

	_wsplitpath_s(
		filePath_w,
		NULL, 0,
		NULL, 0,
		fileName, countof(fileName) - 1,
		extension, countof(extension) - 1
	);

	sl::String string = fileName;
	string.append(extension);
	return string;
#elif (_AXL_OS_POSIX)
	size_t i = filePath.reverseFind('/');
	return i != -1 ? filePath.getSubString(i + 1) : filePath;
#endif
}